

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
::
emplace<slang::BufferID_const&,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
           *this,BufferID *key,convertible_to_value *args)

{
  EntryPointer psVar1;
  EntryPointer psVar2;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_bool>
  pVar3;
  
  current_entry =
       (EntryPointer)
       (*(long *)this + ((ulong)key->id * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x28);
  if (current_entry->distance_from_desired < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar2 = current_entry;
    do {
      if (key->id == (psVar2->field_1).value.first.id) {
        pVar3._8_8_ = 0;
        pVar3.first.current = psVar2;
        return pVar3;
      }
      current_entry = psVar2 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar2 + 1;
      psVar2 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar3 = emplace_new_key<slang::BufferID_const&,ska::flat_hash_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>::convertible_to_value>
                    (this,distance_from_desired,current_entry,key,args);
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }